

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O1

void __thiscall
xLearn::FFMScore::calc_grad_sgd(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  pointer pNVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  real_t *prVar6;
  float fVar7;
  pointer pNVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  pointer pNVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  pointer pNVar17;
  ulong uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar21 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar26 [16];
  
  auVar25 = in_ZMM4._0_16_;
  auVar22._4_60_ = in_register_00001244;
  auVar22._0_4_ = norm;
  auVar21._4_60_ = in_register_00001204;
  auVar21._0_4_ = pg;
  auVar20 = auVar21._0_16_;
  if (norm < 0.0) {
    fVar19 = sqrtf(norm);
    auVar20 = ZEXT416((uint)pg);
    auVar22 = ZEXT464((uint)norm);
  }
  else {
    auVar23 = vsqrtss_avx(auVar22._0_16_,auVar22._0_16_);
    fVar19 = auVar23._0_4_;
  }
  uVar4 = model->num_feat_;
  uVar5 = model->num_field_;
  pNVar8 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar17 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar8 != pNVar17) {
    prVar6 = model->param_w_;
    pNVar13 = pNVar8;
    do {
      uVar12 = pNVar13->feat_id;
      if (uVar12 < uVar4) {
        auVar24 = ZEXT416((uint)prVar6[uVar12]);
        auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * auVar20._0_4_ * pNVar13->feat_val)),
                                  auVar24,ZEXT416((uint)(this->super_Score).regu_lambda_));
        auVar23 = vfnmadd132ss_fma(auVar23,auVar24,ZEXT416((uint)(this->super_Score).learning_rate_)
                                  );
        prVar6[uVar12] = auVar23._0_4_;
      }
      pNVar13 = pNVar13 + 1;
    } while (pNVar13 != pNVar17);
  }
  auVar23 = vfnmadd213ss_fma(ZEXT416((uint)(this->super_Score).learning_rate_),auVar20,
                             ZEXT416((uint)*model->param_b_));
  *model->param_b_ = auVar23._0_4_;
  if (pNVar8 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    auVar24 = vcvtusi2ss_avx512f(auVar25,model->aux_size_);
    auVar23 = vcvtusi2ss_avx512f(auVar25,model->num_K_);
    auVar23 = ZEXT416((uint)(auVar23._0_4_ * 0.25));
    auVar23 = vroundss_avx(auVar23,auVar23,10);
    iVar11 = vcvttss2usi_avx512f(auVar23);
    auVar25 = vcvtusi2ss_avx512f(auVar25,iVar11 << 2);
    uVar12 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar24._0_4_ * auVar25._0_4_)));
    iVar11 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar24._0_4_ * 4.0)));
    prVar6 = model->param_v_;
    fVar19 = (this->super_Score).learning_rate_;
    fVar2 = (this->super_Score).regu_lambda_;
    do {
      if ((pNVar8->field_id < uVar5 && pNVar8->feat_id < uVar4) &&
         (pNVar8 + 1 !=
          (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
          super__Vector_impl_data._M_finish)) {
        fVar3 = pNVar8->feat_val;
        uVar14 = (ulong)(pNVar8->feat_id * uVar5 * uVar12);
        uVar15 = (ulong)(pNVar8->field_id * uVar12);
        pNVar17 = pNVar8;
        pNVar13 = pNVar8 + 1;
        do {
          if ((pNVar17[1].field_id < uVar5 && pNVar17[1].feat_id < uVar4) && (uVar12 != 0)) {
            uVar18 = (ulong)(pNVar17[1].field_id * uVar12);
            uVar16 = (ulong)(pNVar17[1].feat_id * uVar5 * uVar12);
            fVar7 = auVar20._0_4_ * fVar3 * pNVar17[1].feat_val * auVar22._0_4_;
            uVar10 = 0;
            do {
              auVar25 = *(undefined1 (*) [16])(prVar6 + uVar14 + uVar18 + uVar10);
              auVar23 = *(undefined1 (*) [16])(prVar6 + uVar15 + uVar16 + uVar10);
              auVar24._0_4_ = fVar19 * (fVar2 * auVar25._0_4_ + fVar7 * auVar23._0_4_);
              auVar24._4_4_ = fVar19 * (fVar2 * auVar25._4_4_ + fVar7 * auVar23._4_4_);
              auVar24._8_4_ = fVar19 * (fVar2 * auVar25._8_4_ + fVar7 * auVar23._8_4_);
              auVar24._12_4_ = fVar19 * (fVar2 * auVar25._12_4_ + fVar7 * auVar23._12_4_);
              auVar24 = vsubps_avx(auVar25,auVar24);
              auVar26._0_4_ = fVar19 * (fVar7 * auVar25._0_4_ + fVar2 * auVar23._0_4_);
              auVar26._4_4_ = fVar19 * (fVar7 * auVar25._4_4_ + fVar2 * auVar23._4_4_);
              auVar26._8_4_ = fVar19 * (fVar7 * auVar25._8_4_ + fVar2 * auVar23._8_4_);
              auVar26._12_4_ = fVar19 * (fVar7 * auVar25._12_4_ + fVar2 * auVar23._12_4_);
              auVar25 = vsubps_avx(auVar23,auVar26);
              *(undefined1 (*) [16])(prVar6 + uVar14 + uVar18 + uVar10) = auVar24;
              *(undefined1 (*) [16])(prVar6 + uVar15 + uVar16 + uVar10) = auVar25;
              uVar9 = (int)uVar10 + iVar11;
              uVar10 = (ulong)uVar9;
            } while (uVar9 < uVar12);
          }
          pNVar1 = pNVar13 + 1;
          pNVar17 = pNVar13;
          pNVar13 = pNVar1;
        } while (pNVar1 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
      }
      pNVar8 = pNVar8 + 1;
    } while (pNVar8 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_sgd(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wl -= (learning_rate_ * g);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= (learning_rate_ * g);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = model.GetAuxiliarySize() * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * model.GetAuxiliarySize();
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        XMMw1 = _mm_sub_ps(XMMw1, _mm_mul_ps(XMMlr, XMMg1));
        XMMw2 = _mm_sub_ps(XMMw2, _mm_mul_ps(XMMlr, XMMg2));
        _mm_store_ps(w1, XMMw1);
        _mm_store_ps(w2, XMMw2);
      }
    }
  }

}